

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Input.cpp
# Opt level: O0

float __thiscall Input::lr(Input *this)

{
  bool bVar1;
  ulong uVar2;
  long in_RDI;
  double dVar3;
  float pos;
  undefined4 local_24;
  undefined4 local_4;
  
  bVar1 = is_joypad_connected();
  if (bVar1) {
    if ((*(byte *)(in_RDI + 0x182) & 1) == 0) {
      if ((*(byte *)(in_RDI + 0x183) & 1) == 0) {
        local_4 = 0.0;
      }
      else {
        local_4 = 1.0;
      }
    }
    else {
      local_4 = -1.0;
    }
  }
  else {
    uVar2 = al_key_down(in_RDI + 8,0x52);
    if ((uVar2 & 1) == 0) {
      uVar2 = al_key_down(in_RDI + 8,0x53);
      if ((uVar2 & 1) == 0) {
        if (*(long *)(in_RDI + 0x170) == 0) {
          local_4 = 0.0;
        }
        else {
          local_24 = *(float *)(in_RDI + 0x30);
          dVar3 = std::fabs((double)(ulong)(uint)local_24);
          if (SUB84(dVar3,0) <= 0.1) {
            local_24 = 0.0;
          }
          local_4 = local_24;
        }
      }
      else {
        local_4 = 1.0;
      }
    }
    else {
      local_4 = -1.0;
    }
  }
  return local_4;
}

Assistant:

float Input::lr(void)
{
   if (is_joypad_connected()) {
      if (joypad_l) return -1;
      if (joypad_r) return 1;
      return 0;
   }

#ifdef ALLEGRO_IPHONE
   if (button_pressed(0, BB_H-size, size, size))
      return -1;
   return button_pressed(size, BB_H-size, size, size) ? 1 : 0;
#else
   if (al_key_down(&kbdstate, ALLEGRO_KEY_LEFT))
      return -1.0f;
   else if (al_key_down(&kbdstate, ALLEGRO_KEY_RIGHT))
      return 1.0f;
   else if (joystick) {
      float pos = joystate.stick[0].axis[0];
      return fabs(pos) > 0.1 ? pos : 0;
   }
   else
      return 0;
#endif
}